

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O2

string * aeron::Context::getUserName_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  string *in_RDI;
  allocator local_9;
  
  pcVar1 = getenv("USER");
  pcVar2 = "default";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar2,&local_9);
  return in_RDI;
}

Assistant:

inline static std::string getUserName()
    {
        const char *username = ::getenv("USER");
#if (_MSC_VER)
        if (nullptr == username)
        {
            username = ::getenv("USERNAME");
            if (nullptr == username)
            {
                 username = "default";
            }
        }
#else
        if (nullptr == username)
        {
            username = "default";
        }
#endif
        return username;
    }